

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsAddRef(JsRef ref,uint *count)

{
  anon_class_32_4_7974ed1d fn;
  anon_class_16_2_d8842485 fn_00;
  bool bVar1;
  ThreadContext **in_stack_ffffffffffffff98;
  Recycler *recycler;
  ThreadContext *threadContext;
  uint **local_28;
  uint *local_20;
  uint *count_local;
  JsRef ref_local;
  
  if (ref == (JsRef)0x0) {
    ref_local._4_4_ = JsErrorInvalidArgument;
  }
  else {
    if (count != (uint *)0x0) {
      *count = 0;
    }
    local_20 = count;
    count_local = (uint *)ref;
    bVar1 = Js::TaggedNumber::Is(ref);
    if (bVar1) {
      if (local_20 != (uint *)0x0) {
        *local_20 = 1;
      }
      ref_local._4_4_ = JsNoError;
    }
    else {
      bVar1 = JsrtContext::Is(count_local);
      if (bVar1) {
        threadContext = (ThreadContext *)&count_local;
        local_28 = &local_20;
        fn_00.count = local_28;
        fn_00.ref = (JsRef *)threadContext;
        ref_local._4_4_ = GlobalAPIWrapper_NoRecord<JsAddRef::__0>(fn_00);
      }
      else {
        recycler = (Recycler *)ThreadContext::GetContextForCurrentThread();
        if (recycler == (Recycler *)0x0) {
          ref_local._4_4_ = JsErrorNoCurrentContext;
        }
        else {
          ThreadContext::GetRecycler((ThreadContext *)recycler);
          fn.ref = &local_20;
          fn.recycler = (Recycler **)&count_local;
          fn.count = (uint **)&recycler;
          fn.threadContext = in_stack_ffffffffffffff98;
          ref_local._4_4_ = GlobalAPIWrapper<JsAddRef::__1>(fn);
        }
      }
    }
  }
  return ref_local._4_4_;
}

Assistant:

CHAKRA_API JsAddRef(_In_ JsRef ref, _Out_opt_ unsigned int *count)
{
    VALIDATE_JSREF(ref);
    if (count != nullptr)
    {
        *count = 0;
    }

    if (Js::TaggedNumber::Is(ref))
    {
        // The count is always one because these are never collected
        if (count)
        {
            *count = 1;
        }
        return JsNoError;
    }

    if (JsrtContext::Is(ref))
    {
        return GlobalAPIWrapper_NoRecord([&] () -> JsErrorCode
        {
            Recycler * recycler = static_cast<JsrtContext *>(ref)->GetRuntime()->GetThreadContext()->GetRecycler();
            recycler->RootAddRef(ref, count);
            return JsNoError;
        });
    }
    else
    {
        ThreadContext* threadContext = ThreadContext::GetContextForCurrentThread();
        if (threadContext == nullptr)
        {
            return JsErrorNoCurrentContext;
        }
        Recycler * recycler = threadContext->GetRecycler();
        return GlobalAPIWrapper([&] (TTDRecorder& _actionEntryPopper) -> JsErrorCode
        {
            // Note, some references may live in arena-allocated memory, so we need to do this check
            if (!recycler->IsValidObject(ref))
            {
                return JsNoError;
            }

#if ENABLE_TTD
            unsigned int lCount = 0;
            recycler->RootAddRef(ref, &lCount);
            if (count != nullptr)
            {
                *count = lCount;
            }

            if((lCount == 1) && (threadContext->IsRuntimeInTTDMode()) && (!threadContext->TTDLog->IsPropertyRecordRef(ref)))
            {
                Js::RecyclableObject* obj = Js::VarTo<Js::RecyclableObject>(ref);
                if(obj->GetScriptContext()->IsTTDRecordModeEnabled())
                {
                    if(obj->GetScriptContext()->ShouldPerformRecordAction())
                    {
                        threadContext->TTDLog->RecordJsRTAddRootRef(_actionEntryPopper, (Js::Var)ref);
                    }

                    threadContext->TTDContext->AddRootRef_Record(TTD_CONVERT_OBJ_TO_LOG_PTR_ID(obj), obj);
                }
            }
#else
            recycler->RootAddRef(ref, count);
#endif

            return JsNoError;
        });
    }
}